

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint32_t roaring_bitmap_minimum(roaring_bitmap_t *bm)

{
  uint16_t uVar1;
  uint16_t uVar2;
  bitset_container_t *container;
  uint32_t uVar3;
  uint8_t local_11;
  
  if ((bm->high_low_container).size < 1) {
    uVar3 = 0xffffffff;
  }
  else {
    local_11 = *(bm->high_low_container).typecodes;
    uVar1 = *(bm->high_low_container).keys;
    container = (bitset_container_t *)
                container_unwrap_shared(*(bm->high_low_container).containers,&local_11);
    if ((local_11 == '\x03') || (local_11 == '\x02')) {
      if (container->cardinality == 0) {
        uVar2 = 0;
      }
      else {
        uVar2 = (uint16_t)*container->words;
      }
    }
    else {
      if (local_11 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x18d8,"uint16_t container_minimum(const container_t *, uint8_t)");
      }
      uVar2 = bitset_container_minimum(container);
    }
    uVar3 = CONCAT22(uVar1,uVar2);
  }
  return uVar3;
}

Assistant:

uint32_t roaring_bitmap_minimum(const roaring_bitmap_t *bm) {
    if (bm->high_low_container.size > 0) {
        container_t *c = bm->high_low_container.containers[0];
        uint8_t type = bm->high_low_container.typecodes[0];
        uint32_t key = bm->high_low_container.keys[0];
        uint32_t lowvalue = container_minimum(c, type);
        return lowvalue | (key << 16);
    }
    return UINT32_MAX;
}